

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Abc_Cex_t *p;
  char *pcVar6;
  int i;
  Vec_Int_t *p_00;
  int i_00;
  
  Extra_UtilGetoptReset();
  bVar1 = true;
  while (iVar2 = Extra_UtilGetopt(argc,argv,"sh"), iVar2 == 0x73) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 != -1) {
    Abc_Print(-2,"usage: print_status [-sh]\n");
    Abc_Print(-2,"\t        prints verification status\n");
    pcVar6 = "yes";
    if (!bVar1) {
      pcVar6 = "no";
    }
    Abc_Print(-2,"\t-s    : toggle using short print-out [default = %s]\n",pcVar6);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,(ulong)(uint)pAbc->nFrames);
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_001e8e15;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) goto LAB_001e8e15;
  }
  putchar(10);
  iVar2 = 0;
  for (i_00 = 0; i_00 < pAbc->vCexVec->nSize; i_00 = i_00 + 1) {
    p = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,i_00);
    if (p != (Abc_Cex_t *)0x0) {
      if (p == (Abc_Cex_t *)0x1) {
        iVar2 = iVar2 + 1;
      }
      else {
        printf("%4d : ");
        Abc_CexPrintStats(p);
      }
    }
  }
  if (iVar2 != 0) {
    printf("In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n");
  }
LAB_001e8e15:
  p_00 = pAbc->vStatuses;
  if (p_00 != (Vec_Int_t *)0x0) {
    if (bVar1) {
      uVar3 = Vec_IntCountEntry(p_00,0);
      uVar4 = Vec_IntCountEntry(p_00,1);
      uVar5 = Vec_IntCountEntry(p_00,-1);
      printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
             (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)p_00->nSize);
    }
    else {
      for (uVar3 = 0; (int)uVar3 < p_00->nSize; uVar3 = uVar3 + 1) {
        uVar4 = Vec_IntEntry(p_00,uVar3);
        printf("%d=%d  ",(ulong)uVar3,(ulong)uVar4);
        p_00 = pAbc->vStatuses;
      }
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fShort = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
            if ( Counter )
                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).", 
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1), 
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-sh]\n" );
    Abc_Print( -2, "\t        prints verification status\n" );
    Abc_Print( -2, "\t-s    : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}